

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_address.cpp
# Opt level: O1

Address * __thiscall
cfd::ElementsAddressFactory::CreatePegInAddress
          (Address *__return_storage_ptr__,ElementsAddressFactory *this,AddressType address_type,
          Script *tweak_fedpegscript)

{
  NetType NVar1;
  NetType mainchain_net_type;
  NetType NVar2;
  
  NVar1 = (this->super_AddressFactory).type_;
  NVar2 = kRegtest;
  if (NVar1 != kElementsRegtest) {
    NVar2 = NVar1;
  }
  mainchain_net_type = kMainnet;
  if (NVar1 != kLiquidV1) {
    mainchain_net_type = NVar2;
  }
  CreatePegInAddress(__return_storage_ptr__,mainchain_net_type,address_type,tweak_fedpegscript);
  return __return_storage_ptr__;
}

Assistant:

Address ElementsAddressFactory::CreatePegInAddress(
    AddressType address_type, const Script& tweak_fedpegscript) const {
  NetType type = type_;
  if (type == NetType::kLiquidV1)
    type = NetType::kMainnet;
  else if (type == NetType::kElementsRegtest)
    type = NetType::kRegtest;
  return CreatePegInAddress(type, address_type, tweak_fedpegscript);
}